

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecs.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FastPForLib::IntegerCODEC::uncompress
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          IntegerCODEC *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *compresseddata,
          size_t expected_uncompressed_size)

{
  pointer puVar1;
  size_t memavailable;
  allocator_type local_29;
  size_type local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,expected_uncompressed_size,&local_29);
  local_28 = (long)(__return_storage_ptr__->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(__return_storage_ptr__->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  puVar1 = (compresseddata->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
           .super__Vector_impl_data._M_start;
  (*this->_vptr_IntegerCODEC[2])
            (this,puVar1,
             (long)(compresseddata->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(__return_storage_ptr__,local_28);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<uint32_t>
  uncompress(const std::vector<uint32_t> &compresseddata,
             size_t expected_uncompressed_size = 0) {
    std::vector<uint32_t> data(
        expected_uncompressed_size); // allocate plenty of memory
    size_t memavailable = data.size();
    try {
      decodeArray(&compresseddata[0], compresseddata.size(), &data[0],
                  memavailable);
    } catch (NotEnoughStorage &nes) {
      data.resize(nes.required + 1024);
      decodeArray(&compresseddata[0], compresseddata.size(), &data[0],
                  memavailable);
    }
    data.resize(memavailable);
    return data;
  }